

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::ReadKSZ8851DMA(FpgaIO *this,uint16_t *rdata)

{
  bool bVar1;
  uint32_t uVar2;
  quadlet_t read_data;
  uint32_t local_14;
  
  uVar2 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
  if ((4 < uVar2) && (bVar1 = WriteEthernetControl(this,*rdata | 0x9000000), bVar1)) {
    ReadEthernetStatus(this,&local_14);
  }
  return false;
}

Assistant:

bool FpgaIO::ReadKSZ8851DMA(uint16_t &rdata)
{
    if (GetFirmwareVersion() < 5) return false;
    quadlet_t write_data = ETH_CTRL_DMA_V2 | ETH_CTRL_WB_V2 | rdata;
    if (!WriteEthernetControl(write_data))
        return false;
    quadlet_t read_data;
    if (!ReadEthernetStatus(read_data))
        return false;
    // Check if Ethernet is present
    if (!(read_data&ETH_STAT_PRESENT_V2)) return false;
    // Check if last command had an error
    if (read_data&ETH_STAT_REQ_ERR_V2) return false;
    rdata = static_cast<uint16_t>(read_data);
    return true;
}